

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  arm64_reg aVar6;
  MCOperand *pMVar7;
  MCOperand *pMVar8;
  MCOperand *pMVar9;
  MCOperand *pMVar10;
  int64_t iVar11;
  int64_t iVar12;
  ulong uVar13;
  int64_t iVar14;
  undefined *puVar15;
  char *pcVar16;
  cs_insn *pcVar17;
  int iVar18;
  uint uVar19;
  char *pcVar20;
  int iVar21;
  uint uVar22;
  char *AsmStrs_2;
  int iVar23;
  uint val;
  char *AsmStrs;
  uint32_t *RegAsmOffset;
  
  uVar4 = MCInst_getOpcode(MI);
  if (uVar4 != 0x7c2) {
    uVar22 = uVar4 & 0xfffffffe;
    if ((uVar4 - 0x81e < 2) || (uVar4 - 0x500 < 2)) {
      pMVar7 = MCInst_getOperand(MI,0);
      pMVar8 = MCInst_getOperand(MI,1);
      pMVar9 = MCInst_getOperand(MI,2);
      pMVar10 = MCInst_getOperand(MI,3);
      _Var3 = MCOperand_isImm(pMVar9);
      if ((_Var3) &&
         ((iVar11 = MCOperand_getImm(pMVar9), iVar11 == 0 &&
          (_Var3 = MCOperand_isImm(pMVar10), _Var3)))) {
        iVar11 = MCOperand_getImm(pMVar10);
        if (iVar11 == 0x1f) {
          if (((uVar4 == 0x81f) || (uVar4 == 0x501)) && (uVar22 == 0x500)) {
            pcVar16 = "sxtw";
            goto LAB_0016770a;
          }
        }
        else {
          if (iVar11 == 0xf) {
            pcVar20 = "sxth";
            pcVar16 = "uxth";
          }
          else {
            if (iVar11 != 7) goto LAB_00167842;
            pcVar20 = "sxtb";
            pcVar16 = "uxtb";
          }
          if (uVar22 == 0x500) {
            pcVar16 = pcVar20;
          }
          if (uVar22 == 0x500 || uVar4 != 0x81f) {
LAB_0016770a:
            uVar4 = MCOperand_getReg(pMVar7);
            uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
            uVar22 = MCOperand_getReg(pMVar8);
            uVar22 = getWRegFromXReg(uVar22);
            SStream_concat(O,"%s\t%s, %s",pcVar16,getRegisterName_AsmStrsNoRegAltName + uVar4,
                           getRegisterName_AsmStrsNoRegAltName +
                           *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                    (ulong)(uVar22 - 1) * 4));
            if (MI->csh->detail != CS_OPT_OFF) {
              pcVar2 = MI->flat_insn->detail;
              puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e
              ;
              puVar1[0] = '\x01';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              uVar4 = MCOperand_getReg(pMVar7);
              pcVar2 = MI->flat_insn->detail;
              *(uint *)(pcVar2->groups +
                       (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) = uVar4;
              puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar1 = *puVar1 + '\x01';
              pcVar2 = MI->flat_insn->detail;
              puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e
              ;
              puVar1[0] = '\x01';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              uVar4 = MCOperand_getReg(pMVar8);
              uVar4 = getWRegFromXReg(uVar4);
              pcVar2 = MI->flat_insn->detail;
              *(uint *)(pcVar2->groups +
                       (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) = uVar4;
              puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar1 = *puVar1 + '\x01';
            }
            aVar6 = AArch64_map_insn(pcVar16);
            MCInst_setOpcodePub(MI,aVar6);
            return;
          }
        }
      }
LAB_00167842:
      _Var3 = MCOperand_isImm(pMVar9);
      if ((!_Var3) || (_Var3 = MCOperand_isImm(pMVar10), !_Var3)) {
LAB_00167c10:
        iVar11 = MCOperand_getImm(pMVar9);
        iVar12 = MCOperand_getImm(pMVar10);
        uVar5 = MCOperand_getReg(pMVar7);
        uVar5 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar5 - 1) * 4);
        uVar19 = MCOperand_getReg(pMVar8);
        if (iVar12 < iVar11) {
          pcVar16 = "ubfiz";
          if (uVar22 == 0x500) {
            pcVar16 = "sbfiz";
          }
          SStream_concat(O,"%s\t%s, %s, ",pcVar16,getRegisterName_AsmStrsNoRegAltName + uVar5,
                         getRegisterName_AsmStrsNoRegAltName +
                         *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                  (ulong)(uVar19 - 1) * 4));
          iVar21 = (uint)(uVar4 == 0x501 || uVar4 == 0x81f) * 0x20 + 0x20;
          iVar11 = MCOperand_getImm(pMVar9);
          printInt32Bang(O,iVar21 - (int)iVar11);
          SStream_concat0(O,", ");
          iVar11 = MCOperand_getImm(pMVar10);
          printInt32Bang(O,(int)iVar11 + 1);
          aVar6 = AArch64_map_insn(pcVar16);
          MCInst_setOpcodePub(MI,aVar6);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar7);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar9);
          pcVar2 = MI->flat_insn->detail;
          *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               (long)(iVar21 - (int)iVar11);
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar10);
          pcVar2 = MI->flat_insn->detail;
          *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               (long)((int)iVar11 + 1);
          pcVar17 = MI->flat_insn;
        }
        else {
          pcVar16 = "ubfx";
          if (uVar22 == 0x500) {
            pcVar16 = "sbfx";
          }
          SStream_concat(O,"%s\t%s, %s, ",pcVar16,getRegisterName_AsmStrsNoRegAltName + uVar5,
                         getRegisterName_AsmStrsNoRegAltName +
                         *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                  (ulong)(uVar19 - 1) * 4));
          iVar11 = MCOperand_getImm(pMVar9);
          printInt32Bang(O,(int32_t)iVar11);
          SStream_concat0(O,", ");
          iVar11 = MCOperand_getImm(pMVar10);
          iVar12 = MCOperand_getImm(pMVar9);
          printInt32Bang(O,((int)iVar11 - (int)iVar12) + 1);
          aVar6 = AArch64_map_insn(pcVar16);
          MCInst_setOpcodePub(MI,aVar6);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar7);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               uVar4;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar9);
          pcVar2 = MI->flat_insn->detail;
          *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               (long)(int)iVar11;
          puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
          *puVar1 = *puVar1 + '\x01';
          pcVar2 = MI->flat_insn->detail;
          puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar10);
          iVar12 = MCOperand_getImm(pMVar9);
          pcVar2 = MI->flat_insn->detail;
          *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
               (long)(((int)iVar11 - (int)iVar12) + 1);
          pcVar17 = MI->flat_insn;
        }
        goto LAB_001682e3;
      }
      iVar11 = MCOperand_getImm(pMVar9);
      val = (uint)iVar11;
      iVar11 = MCOperand_getImm(pMVar10);
      uVar5 = (uint)iVar11;
      uVar19 = uVar5 + 1 ^ val;
      if (((uVar4 ^ 0x81e) == 0 && uVar19 == 0) && uVar5 != 0x1f) {
        iVar21 = 0x1f;
LAB_001678d5:
        val = iVar21 - uVar5;
        pcVar16 = "lsl";
      }
      else {
        if ((uVar19 == 0 && (uVar4 ^ 0x81f) == 0) && uVar5 != 0x3f) {
          iVar21 = 0x3f;
          goto LAB_001678d5;
        }
        pcVar16 = "lsr";
        if (((uVar4 ^ 0x81e) != 0 || (uVar5 ^ 0x1f) != 0) &&
           ((uVar4 ^ 0x81f) != 0 || (uVar5 ^ 0x3f) != 0)) {
          pcVar16 = "asr";
          if ((uVar4 != 0x500 || (uVar5 ^ 0x1f) != 0) && (uVar4 != 0x501 || (uVar5 ^ 0x3f) != 0))
          goto LAB_00167c10;
        }
      }
      uVar4 = MCOperand_getReg(pMVar7);
      uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
      uVar22 = MCOperand_getReg(pMVar8);
      SStream_concat(O,"%s\t%s, %s, ",pcVar16,getRegisterName_AsmStrsNoRegAltName + uVar4,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar22 - 1) * 4));
      printInt32Bang(O,val);
      aVar6 = AArch64_map_insn(pcVar16);
      MCInst_setOpcodePub(MI,aVar6);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar7);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar8);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           (long)(int)val;
      goto LAB_001682dc;
    }
    if (uVar22 != 0x66) goto switchD_00166edb_caseD_2;
    pMVar7 = MCInst_getOperand(MI,0);
    pMVar8 = MCInst_getOperand(MI,2);
    pMVar9 = MCInst_getOperand(MI,3);
    iVar11 = MCOperand_getImm(pMVar9);
    pMVar9 = MCInst_getOperand(MI,4);
    iVar12 = MCOperand_getImm(pMVar9);
    iVar23 = (int)iVar12;
    iVar21 = (int)iVar11;
    if (iVar23 < iVar21) {
      iVar18 = (uint)(uVar4 == 0x67) * 0x20 + 0x20;
      iVar18 = (iVar18 - iVar21) % iVar18;
      iVar23 = iVar23 + 1;
      uVar4 = MCOperand_getReg(pMVar7);
      uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
      uVar22 = MCOperand_getReg(pMVar8);
      SStream_concat(O,"bfi\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar4,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar22 - 1) * 4));
      printInt32Bang(O,iVar18);
      SStream_concat0(O,", ");
      printInt32Bang(O,iVar23);
      aVar6 = AArch64_map_insn("bfi");
      MCInst_setOpcodePub(MI,aVar6);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar7);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar8);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           (long)iVar18;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    else {
      iVar23 = (iVar23 - iVar21) + 1;
      uVar4 = MCOperand_getReg(pMVar7);
      uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
      uVar22 = MCOperand_getReg(pMVar8);
      SStream_concat(O,"bfxil\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar4,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar22 - 1) * 4));
      printInt32Bang(O,iVar21);
      SStream_concat0(O,", ");
      printInt32Bang(O,iVar23);
      aVar6 = AArch64_map_insn("bfxil");
      MCInst_setOpcodePub(MI,aVar6);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar7);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar8);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           (long)iVar21;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
         (long)iVar23;
    pcVar17 = MI->flat_insn;
    goto LAB_001682e3;
  }
  pMVar7 = MCInst_getOperand(MI,0);
  pMVar8 = MCInst_getOperand(MI,1);
  pMVar9 = MCInst_getOperand(MI,2);
  pMVar10 = MCInst_getOperand(MI,3);
  iVar11 = MCOperand_getImm(pMVar7);
  iVar12 = MCOperand_getImm(pMVar8);
  uVar13 = MCOperand_getImm(pMVar9);
  iVar14 = MCOperand_getImm(pMVar10);
  uVar5 = (uint)iVar14;
  iVar21 = (int)iVar11;
  uVar4 = uVar5;
  uVar22 = uVar5;
  if ((int)iVar12 == 8) {
    switch(uVar13 & 0xffffffff) {
    case 0:
      if (iVar21 != 4) goto switchD_00166edb_caseD_2;
      uVar19 = 0x1c3;
      uVar4 = 0;
      if (uVar5 == 1) {
        iVar21 = 0xf;
        pcVar16 = "tlbi\tipas2e1is";
      }
      else {
        if (uVar5 != 5) goto switchD_00166edb_caseD_2;
        iVar21 = 0x10;
        pcVar16 = "tlbi\tipas2le1is";
      }
      break;
    default:
      goto switchD_00166edb_caseD_2;
    case 3:
      if (iVar21 != 6) {
        if (iVar21 == 4) {
          if ((6 < uVar5) || ((0x73U >> (uVar5 & 0x1f) & 1) == 0)) goto switchD_00166edb_caseD_2;
          uVar13 = (ulong)((uVar5 & 7) << 2);
          pcVar16 = &DAT_001ddbec + *(int *)(&DAT_001ddbec + uVar13);
          puVar15 = &DAT_001ddc08;
        }
        else {
          if (((iVar21 != 0) || (7 < uVar5)) || ((0xafU >> (uVar5 & 0x1f) & 1) == 0))
          goto switchD_00166edb_caseD_2;
          uVar13 = (ulong)((uVar5 & 7) << 2);
          pcVar16 = &DAT_001ddbcc + *(int *)(&DAT_001ddbcc + uVar13);
          puVar15 = &DAT_001df674;
        }
LAB_00167b9e:
        iVar21 = *(int *)(puVar15 + uVar13);
        uVar19 = 0x1c3;
        uVar4 = 0;
        break;
      }
      uVar19 = 0x1c3;
      if (uVar5 != 0) {
        if (uVar5 == 5) {
          uVar4 = 0;
          iVar21 = 0xe;
          pcVar16 = "tlbi\tvale3is";
        }
        else {
          if (uVar5 != 1) goto switchD_00166edb_caseD_2;
          uVar4 = 0;
          iVar21 = 0xd;
          pcVar16 = "tlbi\tvae3is";
        }
        break;
      }
      iVar21 = 0xc;
      pcVar16 = "tlbi\talle3is";
LAB_00168308:
      uVar19 = 0x1c3;
      goto LAB_001681b6;
    case 4:
      if (iVar21 != 4) goto switchD_00166edb_caseD_2;
      uVar19 = 0x1c3;
      uVar4 = 0;
      if (uVar5 == 1) {
        iVar21 = 0x11;
        pcVar16 = "tlbi\tipas2e1";
      }
      else {
        if (uVar5 != 5) goto switchD_00166edb_caseD_2;
        iVar21 = 0x12;
        pcVar16 = "tlbi\tipas2le1";
      }
      break;
    case 7:
      if (iVar21 != 6) {
        if (iVar21 == 4) {
          if ((6 < uVar5) || ((0x73U >> (uVar5 & 0x1f) & 1) == 0)) goto switchD_00166edb_caseD_2;
          uVar13 = (ulong)((uVar5 & 7) << 2);
          pcVar16 = &DAT_001ddc44 + *(int *)(&DAT_001ddc44 + uVar13);
          puVar15 = &DAT_001ddc60;
        }
        else {
          if (((iVar21 != 0) || (7 < uVar5)) || ((0xafU >> (uVar5 & 0x1f) & 1) == 0))
          goto switchD_00166edb_caseD_2;
          uVar13 = (ulong)((uVar5 & 7) << 2);
          pcVar16 = &DAT_001ddc24 + *(int *)(&DAT_001ddc24 + uVar13);
          puVar15 = &DAT_001df694;
        }
        goto LAB_00167b9e;
      }
      uVar19 = 0x1c3;
      if (uVar5 == 0) {
        iVar21 = 0x1e;
        pcVar16 = "tlbi\talle3";
        goto LAB_00168308;
      }
      if (uVar5 == 5) {
        uVar4 = 0;
        iVar21 = 0x20;
        pcVar16 = "tlbi\tvale3";
      }
      else {
        if (uVar5 != 1) goto switchD_00166edb_caseD_2;
        uVar4 = 0;
        iVar21 = 0x1f;
        pcVar16 = "tlbi\tvae3";
      }
    }
LAB_001681b0:
    uVar22 = 0;
    goto LAB_001681b3;
  }
  if ((int)iVar12 != 7) {
switchD_00166edb_caseD_2:
    pcVar16 = printAliasInstr(MI,O,Info);
    if (pcVar16 == (char *)0x0) {
      printInstruction(MI,O,(MCRegisterInfo *)Info);
      return;
    }
    aVar6 = AArch64_map_insn(pcVar16);
    MCInst_setOpcodePub(MI,aVar6);
    (*cs_mem_free)(pcVar16);
    return;
  }
  switch((int)uVar13) {
  case 1:
    if (iVar21 != 0 || uVar5 != 0) goto switchD_00166edb_caseD_2;
    uVar5 = 1;
    pcVar16 = "ic\tialluis";
    goto LAB_00167ad0;
  default:
    goto switchD_00166edb_caseD_2;
  case 4:
    if (uVar5 != 1 || iVar21 != 3) goto switchD_00166edb_caseD_2;
    uVar22 = 1;
    pcVar16 = "dc\tzva";
    break;
  case 5:
    if (iVar21 == 0 && uVar5 == 0) {
      uVar5 = 2;
      pcVar16 = "ic\tiallu";
    }
    else {
      if (uVar5 != 1 || iVar21 != 3) goto switchD_00166edb_caseD_2;
      uVar5 = 3;
      pcVar16 = "ic\tivau";
    }
LAB_00167ad0:
    iVar21 = 0;
    uVar19 = 0x1c0;
    uVar4 = 0;
    uVar22 = 0;
    goto LAB_001681b6;
  case 6:
    if (uVar5 == 2 && iVar21 == 0) {
      uVar22 = 3;
      pcVar16 = "dc\tisw";
    }
    else {
      if (iVar21 != 0 || uVar5 != 1) goto switchD_00166edb_caseD_2;
      uVar22 = 2;
      pcVar16 = "dc\tivac";
    }
    break;
  case 8:
    if (iVar21 == 6) {
      uVar19 = 0x1c2;
      if (uVar5 == 0) {
        pcVar16 = "at\ts1e3r";
        iVar21 = 0;
        uVar4 = 10;
        goto LAB_001681b6;
      }
      if (uVar5 != 1) goto switchD_00166edb_caseD_2;
      uVar4 = 0xb;
      iVar21 = 0;
      pcVar16 = "at\ts1e3w";
    }
    else {
      if (iVar21 == 4) {
        if ((7 < uVar5) || ((0xf3U >> (uVar5 & 0x1f) & 1) == 0)) goto switchD_00166edb_caseD_2;
        uVar4 = (uVar5 & 7) << 2;
        pcVar16 = &DAT_001ddbac + *(int *)(&DAT_001ddbac + uVar4);
        uVar4 = *(uint *)(&DAT_001df654 + uVar4);
      }
      else {
        if ((iVar21 != 0) || (3 < uVar5)) goto switchD_00166edb_caseD_2;
        pcVar16 = &DAT_001ddb9c + *(int *)(&DAT_001ddb9c + (ulong)(uVar5 & 3) * 4);
      }
      uVar19 = 0x1c2;
      iVar21 = 0;
    }
    goto LAB_001681b0;
  case 10:
    if (uVar5 == 1 && iVar21 == 3) {
      uVar22 = 4;
      pcVar16 = "dc\tcvac";
    }
    else {
      if (iVar21 != 0 || uVar5 != 2) goto switchD_00166edb_caseD_2;
      uVar22 = 5;
      pcVar16 = "dc\tcsw";
    }
    break;
  case 0xb:
    if (uVar5 != 1 || iVar21 != 3) goto switchD_00166edb_caseD_2;
    uVar22 = 6;
    pcVar16 = "dc\tcvau";
    break;
  case 0xe:
    if (uVar5 == 1 && iVar21 == 3) {
      uVar22 = 7;
      pcVar16 = "dc\tcivac";
    }
    else {
      if (iVar21 != 0 || uVar5 != 2) goto switchD_00166edb_caseD_2;
      uVar22 = 8;
      pcVar16 = "dc\tcisw";
    }
  }
  iVar21 = 0;
  uVar19 = 0x1c1;
  uVar4 = 0;
LAB_001681b3:
  uVar5 = 0;
LAB_001681b6:
  MCInst_setOpcodePub(MI,uVar19);
  SStream_concat0(O,pcVar16);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = 'D';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
         uVar22 + uVar5 + uVar4 + iVar21;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
  }
  pcVar16 = strstr(pcVar16,"all");
  if (pcVar16 == (char *)0x0) {
    pMVar7 = MCInst_getOperand(MI,4);
    uVar4 = MCOperand_getReg(pMVar7);
    SStream_concat(O,", %s",getRegisterName_AsmStrsNoRegAltName +
                            *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                     (ulong)(uVar4 - 1) * 4));
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
LAB_001682dc:
      pcVar17 = MI->flat_insn;
LAB_001682e3:
      puVar1 = (pcVar17->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}